

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O1

bool __thiscall Json::OurReader::readComment(OurReader *this)

{
  Location pCVar1;
  bool bVar2;
  bool bVar3;
  Char CVar4;
  CommentPlacement CVar5;
  CommentPlacement placement;
  bool cStyleWithEmbeddedNewline;
  bool local_29;
  
  pCVar1 = this->current_;
  if (pCVar1 == this->end_) {
    CVar4 = '\0';
  }
  else {
    this->current_ = pCVar1 + 1;
    CVar4 = *pCVar1;
  }
  local_29 = false;
  if (CVar4 == '*') {
    bVar2 = readCStyleComment(this,&local_29);
  }
  else if (CVar4 == '/') {
    readCppStyleComment(this);
    bVar2 = true;
  }
  else {
    bVar2 = false;
  }
  if ((bVar2 != false) && (this->collectComments_ == true)) {
    CVar5 = commentBefore;
    placement = commentBefore;
    if ((this->lastValueHasAComment_ == false) &&
       (placement = CVar5, this->lastValueEnd_ != (Location)0x0)) {
      bVar3 = containsNewLine(this->lastValueEnd_,pCVar1 + -1);
      if ((!bVar3) && ((CVar4 == '/' || (local_29 == false)))) {
        this->lastValueHasAComment_ = true;
        placement = commentAfterOnSameLine;
      }
    }
    addComment(this,pCVar1 + -1,this->current_,placement);
  }
  return bVar2;
}

Assistant:

bool OurReader::readComment() {
  const Location commentBegin = current_ - 1;
  const Char c = getNextChar();
  bool successful = false;
  bool cStyleWithEmbeddedNewline = false;

  const bool isCStyleComment = (c == '*');
  const bool isCppStyleComment = (c == '/');
  if (isCStyleComment) {
    successful = readCStyleComment(&cStyleWithEmbeddedNewline);
  } else if (isCppStyleComment) {
    successful = readCppStyleComment();
  }

  if (!successful)
    return false;

  if (collectComments_) {
    CommentPlacement placement = commentBefore;

    if (!lastValueHasAComment_) {
      if (lastValueEnd_ && !containsNewLine(lastValueEnd_, commentBegin)) {
        if (isCppStyleComment || !cStyleWithEmbeddedNewline) {
          placement = commentAfterOnSameLine;
          lastValueHasAComment_ = true;
        }
      }
    }

    addComment(commentBegin, current_, placement);
  }
  return true;
}